

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.cpp
# Opt level: O0

void DeleteDelayTest::startTest(vector<int,_std::allocator<int>_> *keys)

{
  allocator<double> *paVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  rep rVar5;
  bool bVar6;
  _Setprecision _Var7;
  iterator __first;
  reference piVar8;
  reference pvVar9;
  reference pvVar10;
  ostream *poVar11;
  size_type sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int local_104;
  type tStack_100;
  int i;
  duration<long,_std::ratio<1L,_1000000L>_> local_f8;
  rep local_f0;
  rep ms;
  time_point end;
  time_point start;
  iterator iStack_d0;
  int key;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  unsigned_long_long totalTime;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> count;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> throughput;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> avgTime;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> time;
  vector<int,_std::allocator<int>_> *keys_local;
  undefined4 uVar16;
  
  __first = std::vector<int,_std::allocator<int>_>::begin(keys);
  time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::vector<int,_std::allocator<int>_>::end(keys);
  std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::allocator<int>::allocator(&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,100,&local_39);
  std::allocator<int>::~allocator(&local_39);
  paVar1 = (allocator<double> *)
           ((long)&throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,100,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&throughput.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<double> *)
           ((long)&count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,100,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<int>::allocator((allocator<int> *)((long)&totalTime + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,100,
             (allocator<int> *)((long)&totalTime + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&totalTime + 7));
  __range1 = (vector<int,_std::allocator<int>_> *)0x0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(keys);
  iStack_d0 = std::vector<int,_std::allocator<int>_>::end(keys);
  while (bVar6 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff30), bVar6) {
    piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar3 = *piVar8;
    end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    KVStore::del(&store,(long)iVar3);
    ms = std::chrono::_V2::system_clock::now();
    tStack_100 = std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&ms,&end);
    local_f8.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&stack0xffffffffffffff00);
    local_f0 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_f8);
    if (iVar3 < 0x40000) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,0);
      rVar5 = local_f0;
      *pvVar9 = *pvVar9 + 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,0);
      *pvVar9 = *pvVar9 + (int)rVar5;
    }
    else if (iVar3 < 0x80000) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,1);
      rVar5 = local_f0;
      *pvVar9 = *pvVar9 + 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,1);
      *pvVar9 = *pvVar9 + (int)rVar5;
    }
    else if (iVar3 < 0x100000) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,2);
      rVar5 = local_f0;
      *pvVar9 = *pvVar9 + 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,2);
      *pvVar9 = *pvVar9 + (int)rVar5;
    }
    else if (iVar3 < 0x180000) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,3);
      rVar5 = local_f0;
      *pvVar9 = *pvVar9 + 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,3);
      *pvVar9 = *pvVar9 + (int)rVar5;
    }
    else {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,4);
      rVar5 = local_f0;
      *pvVar9 = *pvVar9 + 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,4);
      *pvVar9 = *pvVar9 + (int)rVar5;
    }
    __range1 = (vector<int,_std::allocator<int>_> *)
               ((long)&(__range1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + local_f0);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  for (local_104 = 0; local_104 < 5; local_104 = local_104 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_104);
    iVar3 = *pvVar9;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_104);
    iVar4 = *pvVar9;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_68,(long)local_104);
    *pvVar10 = (double)iVar3 / (double)iVar4;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_68,(long)local_104);
    dVar2 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_88,(long)local_104);
    *pvVar10 = (1.0 / dVar2) * 1000.0 * 1000.0;
  }
  poVar11 = std::operator<<((ostream *)&std::cout,">>>>> Delete Test <<<<<");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<((ostream *)&std::cout,
                            "Average Delay And Throughput For Different Size Data: ");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var7 = std::setprecision(2);
  std::operator<<(poVar11,_Var7);
  poVar11 = std::operator<<((ostream *)&std::cout,"0 ~ 0.25MB     : ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_68,0);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,anon_var_dwarf_25ed0);
  poVar11 = std::operator<<(poVar11,"throughput: ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_88,0);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,"/s");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<((ostream *)&std::cout,"0.25MB ~ 0.5MB : ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_68,1);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,anon_var_dwarf_25ed0);
  poVar11 = std::operator<<(poVar11,"throughput: ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_88,1);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,"/s");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<((ostream *)&std::cout,"0.5MB ~ 1MB    : ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_68,2);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,anon_var_dwarf_25ed0);
  poVar11 = std::operator<<(poVar11,"throughput: ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_88,2);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,"/s");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<((ostream *)&std::cout,"1MB ~ 1.5MB    : ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_68,3);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,anon_var_dwarf_25ed0);
  poVar11 = std::operator<<(poVar11,"throughput: ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_88,3);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,"/s");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<((ostream *)&std::cout,"1.5MB ~ 2MB    : ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_68,4);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,anon_var_dwarf_25ed0);
  poVar11 = std::operator<<(poVar11,"throughput: ");
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)local_88,4);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pvVar10);
  poVar11 = std::operator<<(poVar11,"/s");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar11 = std::operator<<((ostream *)&std::cout,"Average Delay: ");
  uVar16 = (undefined4)((ulong)__range1 >> 0x20);
  auVar13._8_4_ = uVar16;
  auVar13._0_8_ = __range1;
  auVar13._12_4_ = 0x45300000;
  sVar12 = std::vector<int,_std::allocator<int>_>::size(keys);
  auVar17._8_4_ = (int)(sVar12 >> 0x20);
  auVar17._0_8_ = sVar12;
  auVar17._12_4_ = 0x45300000;
  poVar11 = (ostream *)
            std::ostream::operator<<
                      (poVar11,((auVar13._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               ((auVar17._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0)));
  poVar11 = std::operator<<(poVar11,anon_var_dwarf_25eda);
  poVar11 = std::operator<<(poVar11,"Average Throughput: ");
  auVar14._8_4_ = uVar16;
  auVar14._0_8_ = __range1;
  auVar14._12_4_ = 0x45300000;
  sVar12 = std::vector<int,_std::allocator<int>_>::size(keys);
  auVar15._8_4_ = (int)(sVar12 >> 0x20);
  auVar15._0_8_ = sVar12;
  auVar15._12_4_ = 0x45300000;
  poVar11 = (ostream *)
            std::ostream::operator<<
                      (poVar11,(1.0 / (((auVar14._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)__range1) -
                                       4503599627370496.0)) /
                                      ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0
                                      )))) * 1000.0 * 1000.0);
  poVar11 = std::operator<<(poVar11,"/s");
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

static void startTest(vector<int> &keys) {
    random_shuffle(keys.begin(), keys.end());

    vector<int> time(100);
    vector<double> avgTime(100);
    vector<double> throughput(100);
    vector<int> count(100);

    unsigned long long totalTime = 0;

    for (auto key : keys) {
      auto start = high_resolution_clock::now();
      store.del(key);
      auto end = high_resolution_clock::now();
      auto ms = duration_cast<microseconds>(end - start).count();

      if (key < 256 * 1024) {
        count[0]++;
        time[0] += ms;
      } else if (key < 512 * 1024) {
        count[1]++;
        time[1] += ms;
      } else if (key < 1024 * 1024) {
        count[2]++;
        time[2] += ms;
      } else if (key < 1536 * 1024) {
        count[3]++;
        time[3] += ms;
      } else {
        count[4]++;
        time[4] += ms;
      }

      totalTime += ms;
    }

    for (int i = 0; i < 5; i++) {
      avgTime[i] = time[i] / (double)count[i];
      throughput[i] = 1 / avgTime[i] * 1000 * 1000;
    }

    cout << ">>>>> Delete Test <<<<<" << endl;
    cout << "Average Delay And Throughput For Different Size Data: " << endl;
    cout << fixed << setprecision(2);
    cout << "0 ~ 0.25MB     : " << avgTime[0] << "µs "
         << "throughput: " << throughput[0] << "/s" << endl;
    cout << "0.25MB ~ 0.5MB : " << avgTime[1] << "µs "
         << "throughput: " << throughput[1] << "/s" << endl;
    cout << "0.5MB ~ 1MB    : " << avgTime[2] << "µs "
         << "throughput: " << throughput[2] << "/s" << endl;
    cout << "1MB ~ 1.5MB    : " << avgTime[3] << "µs "
         << "throughput: " << throughput[3] << "/s" << endl;
    cout << "1.5MB ~ 2MB    : " << avgTime[4] << "µs "
         << "throughput: " << throughput[4] << "/s" << endl;
    cout << endl;
    cout << "Average Delay: " << totalTime / (double)keys.size() << "µs, "
         << "Average Throughput: "
         << 1 / (totalTime / (double)keys.size()) * 1000 * 1000 << "/s" << endl;
    cout << endl;
  }